

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TType * __thiscall
glslang::HlslParseContext::split
          (HlslParseContext *this,TType *type,TString *name,TQualifier *outerQualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  TType *pTVar2;
  TType *type_00;
  pointer pcVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  char *pcVar8;
  char *__src;
  char *__dest;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> __str;
  TString local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  iVar5 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar5 != '\0') {
    iVar5 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar5 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
    }
    pTVar2 = (type->field_13).referentType;
    __dest = *(char **)&pTVar2->field_0x8;
    if (__dest != (pTVar2->qualifier).semanticName) {
      do {
        cVar4 = (**(code **)(**(long **)__dest + 0x148))();
        type_00 = *(TType **)__dest;
        if (cVar4 == '\0') {
          local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          pcVar3 = (name->_M_dataplus)._M_p;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&local_58,pcVar3,pcVar3 + name->_M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&local_58,".");
          lVar6 = (**(code **)(**(long **)__dest + 0x30))();
          pbVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   _M_append(&local_58,*(char **)(lVar6 + 8),*(size_type *)(lVar6 + 0x10));
          local_80._M_dataplus.super_allocator_type.allocator =
               (pbVar7->_M_dataplus).super_allocator_type.allocator;
          local_80._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
          paVar1 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)local_80._M_dataplus._M_p == paVar1) {
            local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          }
          else {
            local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          }
          local_80._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          split(this,type_00,&local_80,outerQualifier);
          __dest = __dest + 0x20;
          pcVar8 = (pTVar2->qualifier).semanticName;
        }
        else {
          iVar5 = (*type->_vptr_TType[0x13])(type);
          splitBuiltIn(this,name,type_00,(TArraySizes *)CONCAT44(extraout_var,iVar5),outerQualifier)
          ;
          __src = __dest + 0x20;
          pcVar8 = (pTVar2->qualifier).semanticName;
          if (__src != pcVar8) {
            memmove(__dest,__src,(long)pcVar8 - (long)__src);
            pcVar8 = (pTVar2->qualifier).semanticName;
          }
          pcVar8 = pcVar8 + -0x20;
          (pTVar2->qualifier).semanticName = pcVar8;
        }
      } while (__dest != pcVar8);
    }
  }
  return type;
}

Assistant:

const TType& HlslParseContext::split(const TType& type, const TString& name, const TQualifier& outerQualifier)
{
    if (type.isStruct()) {
        TTypeList* userStructure = type.getWritableStruct();
        for (auto ioType = userStructure->begin(); ioType != userStructure->end(); ) {
            if (ioType->type->isBuiltIn()) {
                // move out the built-in
                splitBuiltIn(name, *ioType->type, type.getArraySizes(), outerQualifier);
                ioType = userStructure->erase(ioType);
            } else {
                split(*ioType->type, name + "." + ioType->type->getFieldName(), outerQualifier);
                ++ioType;
            }
        }
    }

    return type;
}